

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::
fatal<char_const(&)[93],std::__cxx11::string,unsigned_long,unsigned_int&,unsigned_long_const&>
          (Reporter *this,ReturnCode return_code,char (*args) [93],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          unsigned_long *args_2,uint *args_3,unsigned_long *args_4)

{
  format_string<std::__cxx11::basic_string<char>,_unsigned_long,_unsigned_int_&,_const_unsigned_long_&>
  fmt;
  unsigned_long *args_1_00;
  char *pcVar1;
  undefined8 uVar2;
  char *in_RCX;
  size_t in_RDX;
  ostream *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined8 in_stack_00000008;
  ReturnCode returnCode;
  FatalError *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  char **ppcVar3;
  ostream *in_stack_ffffffffffffff10;
  basic_string_view<char> in_stack_ffffffffffffff18;
  char *local_d8 [3];
  size_t local_c0;
  unsigned_long *in_stack_ffffffffffffffd0;
  
  pcVar1 = "{} fatal: ";
  args_1_00 = (unsigned_long *)std::char_traits<char>::length((char_type *)0x238e7c);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff10,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff08);
  local_c0 = std::char_traits<char>::length((char_type *)0x238f1a);
  fmt.str_.size_ = in_RDX;
  fmt.str_.data_ = in_RCX;
  returnCode = in_stack_00000008._4_4_;
  ::fmt::v10::print<std::__cxx11::string,unsigned_long,unsigned_int&,unsigned_long_const&>
            (in_R8,fmt,in_R9,args_1_00,(uint *)pcVar1,in_stack_ffffffffffffffd0);
  ppcVar3 = local_d8;
  local_d8[0] = "\n";
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x238fd1);
  ppcVar3[1] = pcVar1;
  ::fmt::v10::print<>(in_stack_ffffffffffffff10,(format_string<>)in_stack_ffffffffffffff18);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(in_stack_fffffffffffffee0,returnCode);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }